

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O3

string * __thiscall
bloaty::ItaniumDemangle_abi_cxx11_
          (string *__return_storage_ptr__,bloaty *this,string_view symbol,DataSource source)

{
  bool bVar1;
  size_t sVar2;
  char *__s;
  short *psVar3;
  bloaty *pbVar4;
  short *mangled_name;
  bloaty *pbVar5;
  char demangled [1024];
  bloaty abStack_428 [1024];
  
  psVar3 = (short *)symbol._M_len;
  pbVar4 = abStack_428;
  if ((int)symbol._M_str - 0xbU < 0xfffffffe) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  else {
    mangled_name = psVar3;
    if ((bloaty *)0x2 < this) {
      mangled_name = (short *)((ulong)((char)psVar3[1] == 'Z' && *psVar3 == 0x5f5f) + (long)psVar3);
    }
    if ((int)symbol._M_str == 10) {
      bVar1 = absl::debugging_internal::Demangle((char *)mangled_name,(char *)abStack_428,0x400);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (bVar1) {
        sVar2 = strlen((char *)abStack_428);
        pbVar5 = abStack_428 + sVar2;
        goto LAB_0017d71e;
      }
    }
    else {
      __s = __cxa_demangle((char *)mangled_name,(char *)0x0,(size_t *)0x0,(int *)0x0);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (__s != (char *)0x0) {
        sVar2 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,__s,__s + sVar2);
        free(__s);
        return __return_storage_ptr__;
      }
    }
  }
  pbVar5 = this + (long)psVar3;
  pbVar4 = (bloaty *)psVar3;
LAB_0017d71e:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pbVar4,pbVar5);
  return __return_storage_ptr__;
}

Assistant:

std::string ItaniumDemangle(string_view symbol, DataSource source) {
  if (source != DataSource::kShortSymbols &&
      source != DataSource::kFullSymbols) {
    // No demangling.
    return std::string(symbol);
  }

  string_view demangle_from = symbol;
  if (absl::StartsWith(demangle_from, "__Z")) {
    demangle_from.remove_prefix(1);
  }

  if (source == DataSource::kShortSymbols) {
    char demangled[1024];
    if (absl::debugging_internal::Demangle(demangle_from.data(), demangled,
                                           sizeof(demangled))) {
      return std::string(demangled);
    } else {
      return std::string(symbol);
    }
  } else if (source == DataSource::kFullSymbols) {
    char* demangled = __cxa_demangle(demangle_from.data(), NULL, NULL, NULL);
    if (demangled) {
      std::string ret(demangled);
      free(demangled);
      return ret;
    } else {
      return std::string(symbol);
    }
  } else {
    printf("Unexpected source: %d\n", (int)source);
    BLOATY_UNREACHABLE();
  }
}